

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_extract.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
read_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,char *path)

{
  FILE *__stream;
  uchar *__ptr;
  pointer puVar1;
  allocator<unsigned_char> local_41;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  long len;
  FILE *file;
  char *path_local;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  }
  else {
    fseek(__stream,0,2);
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)ftell(__stream);
    rewind(__stream);
    puVar1 = result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    std::allocator<unsigned_char>::allocator(&local_41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,(size_type)puVar1,
               &local_41);
    std::allocator<unsigned_char>::~allocator(&local_41);
    __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    puVar1 = (pointer)fread(__ptr,1,(size_t)result.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            __stream);
    if (puVar1 == result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      fclose(__stream);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    }
    else {
      fclose(__stream);
      memset(__return_storage_ptr__,0,0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<uint8_t> read_file(const char *path)
{
	FILE *file = fopen(path, "rb");
	if (!file)
		return {};

	fseek(file, 0, SEEK_END);
	auto len = ftell(file);
	rewind(file);
	std::vector<uint8_t> result(len);
	if (fread(result.data(), 1, len, file) != size_t(len))
	{
		fclose(file);
		return {};
	}

	fclose(file);
	return result;
}